

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::calculateProblemRanges
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  undefined8 *puVar1;
  double a;
  char cVar2;
  int iVar3;
  pointer pnVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int32_t *piVar10;
  fpclass_type fVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  uint *puVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  long lVar16;
  long in_FS_OFFSET;
  byte bVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxside;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minside;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxbound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minbound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxobj;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minobj;
  cpp_dec_float<200U,_int,_void> local_5b8;
  cpp_dec_float<200U,_int,_void> local_538;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  uint local_458 [3];
  undefined3 uStack_44b;
  int iStack_448;
  bool bStack_444;
  undefined8 local_440;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  uint local_3d8 [3];
  undefined3 uStack_3cb;
  undefined5 uStack_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [32];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [13];
  undefined3 uStack_34b;
  int iStack_348;
  bool bStack_344;
  undefined8 local_340;
  cpp_dec_float<200U,_int,_void> local_338;
  cpp_dec_float<200U,_int,_void> local_2b8;
  cpp_dec_float<200U,_int,_void> local_238;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar17 = 0;
  ::soplex::infinity::__tls_init();
  a = *(double *)(in_FS_OFFSET + -8);
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_138,a);
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 0x1c;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems[6] = 0;
  local_1b8.data._M_elems[7] = 0;
  local_1b8.data._M_elems[8] = 0;
  local_1b8.data._M_elems[9] = 0;
  local_1b8.data._M_elems[10] = 0;
  local_1b8.data._M_elems[0xb] = 0;
  local_1b8.data._M_elems[0xc] = 0;
  local_1b8.data._M_elems[0xd] = 0;
  local_1b8.data._M_elems[0xe] = 0;
  local_1b8.data._M_elems[0xf] = 0;
  local_1b8.data._M_elems[0x10] = 0;
  local_1b8.data._M_elems[0x11] = 0;
  local_1b8.data._M_elems[0x12] = 0;
  local_1b8.data._M_elems[0x13] = 0;
  local_1b8.data._M_elems[0x14] = 0;
  local_1b8.data._M_elems[0x15] = 0;
  local_1b8.data._M_elems[0x16] = 0;
  local_1b8.data._M_elems[0x17] = 0;
  local_1b8.data._M_elems[0x18] = 0;
  local_1b8.data._M_elems[0x19] = 0;
  local_1b8.data._M_elems._104_5_ = 0;
  local_1b8.data._M_elems[0x1b]._1_3_ = 0;
  local_1b8.exp = 0;
  local_1b8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_1b8,0.0);
  ::soplex::infinity::__tls_init();
  local_238.fpclass = cpp_dec_float_finite;
  local_238.prec_elem = 0x1c;
  local_238.data._M_elems[0] = 0;
  local_238.data._M_elems[1] = 0;
  local_238.data._M_elems[2] = 0;
  local_238.data._M_elems[3] = 0;
  local_238.data._M_elems[4] = 0;
  local_238.data._M_elems[5] = 0;
  local_238.data._M_elems[6] = 0;
  local_238.data._M_elems[7] = 0;
  local_238.data._M_elems[8] = 0;
  local_238.data._M_elems[9] = 0;
  local_238.data._M_elems[10] = 0;
  local_238.data._M_elems[0xb] = 0;
  local_238.data._M_elems[0xc] = 0;
  local_238.data._M_elems[0xd] = 0;
  local_238.data._M_elems[0xe] = 0;
  local_238.data._M_elems[0xf] = 0;
  local_238.data._M_elems[0x10] = 0;
  local_238.data._M_elems[0x11] = 0;
  local_238.data._M_elems[0x12] = 0;
  local_238.data._M_elems[0x13] = 0;
  local_238.data._M_elems[0x14] = 0;
  local_238.data._M_elems[0x15] = 0;
  local_238.data._M_elems[0x16] = 0;
  local_238.data._M_elems[0x17] = 0;
  local_238.data._M_elems[0x18] = 0;
  local_238.data._M_elems[0x19] = 0;
  local_238.data._M_elems._104_5_ = 0;
  local_238.data._M_elems[0x1b]._1_3_ = 0;
  local_238.exp = 0;
  local_238.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_238,a);
  local_2b8.fpclass = cpp_dec_float_finite;
  local_2b8.prec_elem = 0x1c;
  local_2b8.data._M_elems[0] = 0;
  local_2b8.data._M_elems[1] = 0;
  local_2b8.data._M_elems[2] = 0;
  local_2b8.data._M_elems[3] = 0;
  local_2b8.data._M_elems[4] = 0;
  local_2b8.data._M_elems[5] = 0;
  local_2b8.data._M_elems[6] = 0;
  local_2b8.data._M_elems[7] = 0;
  local_2b8.data._M_elems[8] = 0;
  local_2b8.data._M_elems[9] = 0;
  local_2b8.data._M_elems[10] = 0;
  local_2b8.data._M_elems[0xb] = 0;
  local_2b8.data._M_elems[0xc] = 0;
  local_2b8.data._M_elems[0xd] = 0;
  local_2b8.data._M_elems[0xe] = 0;
  local_2b8.data._M_elems[0xf] = 0;
  local_2b8.data._M_elems[0x10] = 0;
  local_2b8.data._M_elems[0x11] = 0;
  local_2b8.data._M_elems[0x12] = 0;
  local_2b8.data._M_elems[0x13] = 0;
  local_2b8.data._M_elems[0x14] = 0;
  local_2b8.data._M_elems[0x15] = 0;
  local_2b8.data._M_elems[0x16] = 0;
  local_2b8.data._M_elems[0x17] = 0;
  local_2b8.data._M_elems[0x18] = 0;
  local_2b8.data._M_elems[0x19] = 0;
  local_2b8.data._M_elems._104_5_ = 0;
  local_2b8.data._M_elems[0x1b]._1_3_ = 0;
  local_2b8.exp = 0;
  local_2b8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_2b8,0.0);
  ::soplex::infinity::__tls_init();
  local_338.fpclass = cpp_dec_float_finite;
  local_338.prec_elem = 0x1c;
  local_338.data._M_elems[0] = 0;
  local_338.data._M_elems[1] = 0;
  local_338.data._M_elems[2] = 0;
  local_338.data._M_elems[3] = 0;
  local_338.data._M_elems[4] = 0;
  local_338.data._M_elems[5] = 0;
  local_338.data._M_elems[6] = 0;
  local_338.data._M_elems[7] = 0;
  local_338.data._M_elems[8] = 0;
  local_338.data._M_elems[9] = 0;
  local_338.data._M_elems[10] = 0;
  local_338.data._M_elems[0xb] = 0;
  local_338.data._M_elems[0xc] = 0;
  local_338.data._M_elems[0xd] = 0;
  local_338.data._M_elems[0xe] = 0;
  local_338.data._M_elems[0xf] = 0;
  local_338.data._M_elems[0x10] = 0;
  local_338.data._M_elems[0x11] = 0;
  local_338.data._M_elems[0x12] = 0;
  local_338.data._M_elems[0x13] = 0;
  local_338.data._M_elems[0x14] = 0;
  local_338.data._M_elems[0x15] = 0;
  local_338.data._M_elems[0x16] = 0;
  local_338.data._M_elems[0x17] = 0;
  local_338.data._M_elems[0x18] = 0;
  local_338.data._M_elems[0x19] = 0;
  local_338.data._M_elems._104_5_ = 0;
  local_338.data._M_elems[0x1b]._1_3_ = 0;
  local_338.exp = 0;
  local_338.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_338,a);
  local_340._0_4_ = cpp_dec_float_finite;
  local_340._4_4_ = 0x1c;
  local_3b8._0_16_ = (undefined1  [16])0x0;
  local_3b8._16_16_ = (undefined1  [16])0x0;
  local_398 = (undefined1  [16])0x0;
  local_388 = (undefined1  [16])0x0;
  local_378 = (undefined1  [16])0x0;
  local_368 = (undefined1  [16])0x0;
  local_358 = SUB1613((undefined1  [16])0x0,0);
  uStack_34b = 0;
  iStack_348 = 0;
  bStack_344 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_3b8,0.0);
  if (0 < (this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar8 = 0x78;
    lVar16 = 0;
    do {
      pnVar4 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar8);
      iVar7 = *(int *)(puVar1 + -1);
      cVar2 = *(char *)((long)puVar1 + -4);
      uVar5 = *puVar1;
      memmove(&local_5b8,puVar1 + -0xf,0x70);
      local_5b8.neg = (bool)cVar2;
      if ((cVar2 == '\x01') &&
         ((fpclass_type)uVar5 != cpp_dec_float_finite || local_5b8.data._M_elems[0] != 0)) {
        local_5b8.neg = false;
      }
      iVar3 = *(int *)((long)&(pnVar4->m_backend).data + lVar8 + -8);
      cVar2 = *(char *)((long)&(pnVar4->m_backend).data + lVar8 + -4);
      uVar6 = *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar8);
      local_5b8.exp = iVar7;
      local_5b8._120_8_ = uVar5;
      memmove(&local_538,puVar1 + -0xf,0x70);
      local_538.neg = (bool)cVar2;
      if ((cVar2 == '\x01') &&
         ((fpclass_type)uVar6 != cpp_dec_float_finite || local_538.data._M_elems[0] != 0)) {
        local_538.neg = false;
      }
      local_538.exp = iVar3;
      local_538._120_8_ = uVar6;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::obj(&local_b0,
            &this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ,(int)lVar16);
      pnVar12 = &local_b0;
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pcVar13->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar17 * -8 + 4);
      }
      iStack_448 = local_b0.m_backend.exp;
      bStack_444 = local_b0.m_backend.neg;
      local_440._0_4_ = local_b0.m_backend.fpclass;
      local_440._4_4_ = local_b0.m_backend.prec_elem;
      if ((local_b0.m_backend.neg == true) &&
         (local_b0.m_backend.fpclass != cpp_dec_float_finite || local_4b8._0_4_ != 0)) {
        bStack_444 = false;
      }
      ::soplex::infinity::__tls_init();
      local_3c0._0_4_ = cpp_dec_float_finite;
      local_3c0._4_4_ = 0x1c;
      local_438 = (undefined1  [16])0x0;
      local_428 = (undefined1  [16])0x0;
      local_418 = (undefined1  [16])0x0;
      local_408 = (undefined1  [16])0x0;
      local_3f8 = (undefined1  [16])0x0;
      local_3e8 = (undefined1  [16])0x0;
      local_3d8[0] = 0;
      local_3d8[1] = 0;
      stack0xfffffffffffffc30 = 0;
      uStack_3cb = 0;
      uStack_3c8._0_4_ = 0;
      uStack_3c8._4_1_ = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_438,a);
      if (((local_5b8.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_3c0 != cpp_dec_float_NaN)) &&
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_5b8,(cpp_dec_float<200U,_int,_void> *)local_438), iVar7 < 0)) {
        if (local_5b8.fpclass == cpp_dec_float_NaN || local_238.fpclass == cpp_dec_float_NaN) {
LAB_0050c5e7:
          pcVar13 = &local_5b8;
          pcVar15 = &local_238;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar17 * -8 + 4);
          }
          local_238.exp = local_5b8.exp;
          local_238.neg = local_5b8.neg;
          local_238.fpclass = local_5b8.fpclass;
          pcVar13 = &local_5b8;
          fVar11 = local_5b8.fpclass;
        }
        else {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_238,&local_5b8);
          pcVar13 = &local_238;
          fVar11 = local_5b8.fpclass;
          if (-1 < iVar7) goto LAB_0050c5e7;
        }
        local_238.prec_elem = pcVar13->prec_elem;
        if ((local_2b8.fpclass == cpp_dec_float_NaN) || (fVar11 == cpp_dec_float_NaN)) {
LAB_0050c663:
          pcVar13 = &local_5b8;
          pcVar15 = &local_2b8;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar17 * -8 + 4);
          }
          local_2b8.exp = local_5b8.exp;
          local_2b8.neg = local_5b8.neg;
          local_2b8.fpclass = fVar11;
          pcVar13 = &local_5b8;
        }
        else {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_2b8,&local_5b8);
          pcVar13 = &local_2b8;
          if (iVar7 < 1) {
            fVar11 = local_5b8.fpclass;
            goto LAB_0050c663;
          }
        }
        local_2b8.prec_elem = pcVar13->prec_elem;
      }
      ::soplex::infinity::__tls_init();
      local_3c0._0_4_ = cpp_dec_float_finite;
      local_3c0._4_4_ = 0x1c;
      local_438 = ZEXT816(0);
      local_428 = ZEXT816(0);
      local_418 = ZEXT816(0);
      local_408 = ZEXT816(0);
      local_3f8 = ZEXT816(0);
      local_3e8 = ZEXT816(0);
      local_3d8[0] = 0;
      local_3d8[1] = 0;
      stack0xfffffffffffffc30 = 0;
      uStack_3cb = 0;
      uStack_3c8._0_4_ = 0;
      uStack_3c8._4_1_ = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_438,a);
      if (((local_538.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_3c0 != cpp_dec_float_NaN)) &&
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_538,(cpp_dec_float<200U,_int,_void> *)local_438), iVar7 < 0)) {
        if (local_538.fpclass == cpp_dec_float_NaN || local_238.fpclass == cpp_dec_float_NaN) {
LAB_0050c78a:
          pcVar13 = &local_538;
          pcVar15 = &local_238;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar17 * -8 + 4);
          }
          local_238.exp = local_538.exp;
          local_238.neg = local_538.neg;
          local_238.fpclass = local_538.fpclass;
          pcVar13 = &local_538;
          fVar11 = local_538.fpclass;
        }
        else {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_238,&local_538);
          pcVar13 = &local_238;
          fVar11 = local_538.fpclass;
          if (-1 < iVar7) goto LAB_0050c78a;
        }
        local_238.prec_elem = pcVar13->prec_elem;
        if ((local_2b8.fpclass == cpp_dec_float_NaN) || (fVar11 == cpp_dec_float_NaN)) {
LAB_0050c80c:
          pcVar13 = &local_538;
          pcVar15 = &local_2b8;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar17 * -8 + 4);
          }
          local_2b8.exp = local_538.exp;
          local_2b8.neg = local_538.neg;
          local_2b8.fpclass = fVar11;
          pcVar13 = &local_538;
        }
        else {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_2b8,&local_538);
          pcVar13 = &local_2b8;
          if (iVar7 < 1) {
            fVar11 = local_538.fpclass;
            goto LAB_0050c80c;
          }
        }
        local_2b8.prec_elem = pcVar13->prec_elem;
      }
      if ((fpclass_type)local_440 == cpp_dec_float_NaN || local_138.fpclass == cpp_dec_float_NaN) {
LAB_0050c896:
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
        pcVar15 = &local_138;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar17 * -8 + 4);
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar17 * -8 + 4);
        }
        local_138.exp = iStack_448;
        local_138.neg = bStack_444;
        local_138.fpclass = (fpclass_type)local_440;
        piVar10 = (int32_t *)((long)&local_440 + 4);
        fVar11 = (fpclass_type)local_440;
      }
      else {
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_138,(cpp_dec_float<200U,_int,_void> *)local_4b8);
        piVar10 = &local_138.prec_elem;
        fVar11 = (fpclass_type)local_440;
        if (-1 < iVar7) goto LAB_0050c896;
      }
      local_138.prec_elem = *piVar10;
      if ((local_1b8.fpclass == cpp_dec_float_NaN) || (fVar11 == cpp_dec_float_NaN)) {
LAB_0050c90e:
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
        pcVar15 = &local_1b8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar17 * -8 + 4);
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar17 * -8 + 4);
        }
        local_1b8.exp = iStack_448;
        local_1b8.neg = bStack_444;
        local_1b8.fpclass = fVar11;
        piVar10 = (int32_t *)((long)&local_440 + 4);
      }
      else {
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_1b8,(cpp_dec_float<200U,_int,_void> *)local_4b8);
        piVar10 = &local_1b8.prec_elem;
        if (iVar7 < 1) {
          fVar11 = (fpclass_type)local_440;
          goto LAB_0050c90e;
        }
      }
      local_1b8.prec_elem = *piVar10;
      lVar16 = lVar16 + 1;
      lVar8 = lVar8 + 0x80;
    } while (lVar16 < (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  if (0 < (this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar16 = 0x78;
    lVar8 = 0;
    do {
      puVar1 = (undefined8 *)
               ((long)&(((this->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .left.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar16);
      iVar7 = *(int *)(puVar1 + -1);
      cVar2 = *(char *)((long)puVar1 + -4);
      uVar5 = *puVar1;
      memmove(&local_5b8,puVar1 + -0xf,0x70);
      local_5b8.neg = (bool)cVar2;
      if ((cVar2 == '\x01') &&
         ((fpclass_type)uVar5 != cpp_dec_float_finite || local_5b8.data._M_elems[0] != 0)) {
        local_5b8.neg = false;
      }
      puVar1 = (undefined8 *)
               ((long)&(((this->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .right.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar16);
      iVar3 = *(int *)(puVar1 + -1);
      cVar2 = *(char *)((long)puVar1 + -4);
      uVar6 = *puVar1;
      local_5b8.exp = iVar7;
      local_5b8._120_8_ = uVar5;
      memmove(&local_538,puVar1 + -0xf,0x70);
      local_538.neg = (bool)cVar2;
      if ((cVar2 == '\x01') &&
         ((fpclass_type)uVar6 != cpp_dec_float_finite || local_538.data._M_elems[0] != 0)) {
        local_538.neg = false;
      }
      local_538.exp = iVar3;
      local_538._120_8_ = uVar6;
      ::soplex::infinity::__tls_init();
      local_440._0_4_ = cpp_dec_float_finite;
      local_440._4_4_ = 0x1c;
      local_4b8 = (undefined1  [16])0x0;
      local_4a8 = (undefined1  [16])0x0;
      local_498 = (undefined1  [16])0x0;
      local_488 = (undefined1  [16])0x0;
      local_478 = (undefined1  [16])0x0;
      local_468 = (undefined1  [16])0x0;
      local_458[0] = 0;
      local_458[1] = 0;
      stack0xfffffffffffffbb0 = 0;
      uStack_44b = 0;
      iStack_448 = 0;
      bStack_444 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_4b8,a);
      if (((local_5b8.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_440 != cpp_dec_float_NaN)) &&
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_5b8,(cpp_dec_float<200U,_int,_void> *)local_4b8), 0 < iVar7)) {
        if (local_5b8.fpclass == cpp_dec_float_NaN || local_338.fpclass == cpp_dec_float_NaN) {
LAB_0050cb56:
          pcVar13 = &local_5b8;
          pcVar15 = &local_338;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar17 * -8 + 4);
          }
          local_338.exp = local_5b8.exp;
          local_338.neg = local_5b8.neg;
          local_338.fpclass = local_5b8.fpclass;
          pcVar13 = &local_5b8;
          fVar11 = local_5b8.fpclass;
        }
        else {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_338,&local_5b8);
          pcVar13 = &local_338;
          fVar11 = local_5b8.fpclass;
          if (-1 < iVar7) goto LAB_0050cb56;
        }
        local_338.prec_elem = pcVar13->prec_elem;
        if (((fpclass_type)local_340 == cpp_dec_float_NaN) || (fVar11 == cpp_dec_float_NaN)) {
LAB_0050cbd2:
          pcVar13 = &local_5b8;
          puVar14 = (uint *)local_3b8;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar14 = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
            puVar14 = puVar14 + (ulong)bVar17 * -2 + 1;
          }
          iStack_348 = local_5b8.exp;
          bStack_344 = local_5b8.neg;
          local_340._0_4_ = fVar11;
          piVar10 = &local_5b8.prec_elem;
        }
        else {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_3b8,&local_5b8);
          piVar10 = (int32_t *)((long)&local_340 + 4);
          if (iVar7 < 1) {
            fVar11 = local_5b8.fpclass;
            goto LAB_0050cbd2;
          }
        }
        local_340._4_4_ = *piVar10;
      }
      ::soplex::infinity::__tls_init();
      local_440._0_4_ = cpp_dec_float_finite;
      local_440._4_4_ = 0x1c;
      local_4b8 = ZEXT816(0);
      local_4a8 = ZEXT816(0);
      local_498 = ZEXT816(0);
      local_488 = ZEXT816(0);
      local_478 = ZEXT816(0);
      local_468 = ZEXT816(0);
      local_458[0] = 0;
      local_458[1] = 0;
      stack0xfffffffffffffbb0 = 0;
      uStack_44b = 0;
      iStack_448 = 0;
      bStack_444 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_4b8,a);
      if (((local_538.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_440 != cpp_dec_float_NaN)) &&
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_538,(cpp_dec_float<200U,_int,_void> *)local_4b8), iVar7 < 0)) {
        if (local_538.fpclass == cpp_dec_float_NaN || local_338.fpclass == cpp_dec_float_NaN) {
LAB_0050ccf9:
          pcVar13 = &local_538;
          pcVar15 = &local_338;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar17 * -8 + 4);
          }
          local_338.exp = local_538.exp;
          local_338.neg = local_538.neg;
          local_338.fpclass = local_538.fpclass;
          pcVar13 = &local_538;
          fVar11 = local_538.fpclass;
        }
        else {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_338,&local_538);
          pcVar13 = &local_338;
          fVar11 = local_538.fpclass;
          if (-1 < iVar7) goto LAB_0050ccf9;
        }
        local_338.prec_elem = pcVar13->prec_elem;
        if (((fpclass_type)local_340 == cpp_dec_float_NaN) || (fVar11 == cpp_dec_float_NaN)) {
LAB_0050cd7b:
          pcVar13 = &local_538;
          puVar14 = (uint *)local_3b8;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar14 = (pcVar13->data)._M_elems[0];
            pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
            puVar14 = puVar14 + (ulong)bVar17 * -2 + 1;
          }
          iStack_348 = local_538.exp;
          bStack_344 = local_538.neg;
          local_340._0_4_ = fVar11;
          piVar10 = &local_538.prec_elem;
        }
        else {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_3b8,&local_538);
          piVar10 = (int32_t *)((long)&local_340 + 4);
          if (iVar7 < 1) {
            fVar11 = local_538.fpclass;
            goto LAB_0050cd7b;
          }
        }
        local_340._4_4_ = *piVar10;
      }
      lVar8 = lVar8 + 1;
      lVar16 = lVar16 + 0x80;
    } while (lVar8 < (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
  }
  pcVar13 = &local_2b8;
  pcVar15 = &local_5b8;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar17 * -8 + 4);
    pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar17 * -8 + 4);
  }
  local_5b8.exp = local_2b8.exp;
  local_5b8.neg = local_2b8.neg;
  local_5b8.fpclass = local_2b8.fpclass;
  local_5b8.prec_elem = local_2b8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_5b8,&local_238)
  ;
  pcVar13 = &local_5b8;
  pnVar12 = &this->boundrange;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pnVar12->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar17 * -8 + 4);
    pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar12 + (ulong)bVar17 * -8 + 4);
  }
  (this->boundrange).m_backend.exp = local_5b8.exp;
  (this->boundrange).m_backend.neg = local_5b8.neg;
  (this->boundrange).m_backend.fpclass = local_5b8.fpclass;
  (this->boundrange).m_backend.prec_elem = local_5b8.prec_elem;
  puVar14 = (uint *)local_3b8;
  pcVar13 = &local_5b8;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pcVar13->data)._M_elems[0] = *puVar14;
    puVar14 = puVar14 + (ulong)bVar17 * -2 + 1;
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar17 * -8 + 4);
  }
  local_5b8.exp = iStack_348;
  local_5b8.neg = bStack_344;
  local_5b8.fpclass = (fpclass_type)local_340;
  local_5b8.prec_elem = local_340._4_4_;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_5b8,&local_338)
  ;
  pcVar13 = &local_5b8;
  pnVar12 = &this->siderange;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pnVar12->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar17 * -8 + 4);
    pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar12 + (ulong)bVar17 * -8 + 4);
  }
  (this->siderange).m_backend.exp = local_5b8.exp;
  (this->siderange).m_backend.neg = local_5b8.neg;
  (this->siderange).m_backend.fpclass = local_5b8.fpclass;
  (this->siderange).m_backend.prec_elem = local_5b8.prec_elem;
  pcVar13 = &local_1b8;
  pcVar15 = &local_5b8;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar17 * -8 + 4);
    pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar17 * -8 + 4);
  }
  local_5b8.exp = local_1b8.exp;
  local_5b8.neg = local_1b8.neg;
  local_5b8.fpclass = local_1b8.fpclass;
  local_5b8.prec_elem = local_1b8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_5b8,&local_138)
  ;
  pcVar13 = &local_5b8;
  pnVar12 = &this->objrange;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pnVar12->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar17 * -8 + 4);
    pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar12 + (ulong)bVar17 * -8 + 4);
  }
  (this->objrange).m_backend.exp = local_5b8.exp;
  (this->objrange).m_backend.neg = local_5b8.neg;
  (this->objrange).m_backend.fpclass = local_5b8.fpclass;
  (this->objrange).m_backend.prec_elem = local_5b8.prec_elem;
  return;
}

Assistant:

void SPxSolverBase<R>::calculateProblemRanges()
{
   // only collect absolute values
   R minobj = R(infinity);
   R maxobj = 0.0;
   R minbound = R(infinity);
   R maxbound = 0.0;
   R minside = R(infinity);
   R maxside = 0.0;

   // get min and max absolute values of bounds and objective
   for(int j = 0; j < this->nCols(); ++j)
   {
      R abslow = spxAbs(this->lower(j));
      R absupp = spxAbs(this->lower(j));
      R absobj = spxAbs(this->obj(j));

      if(abslow < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, abslow);
         maxbound = SOPLEX_MAX(maxbound, abslow);
      }

      if(absupp < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, absupp);
         maxbound = SOPLEX_MAX(maxbound, absupp);
      }

      minobj = SOPLEX_MIN(minobj, absobj);
      maxobj = SOPLEX_MAX(maxobj, absobj);
   }

   // get min and max absoute values of sides
   for(int i = 0; i < this->nRows(); ++i)
   {
      R abslhs = spxAbs(this->lhs(i));
      R absrhs = spxAbs(this->rhs(i));

      if(abslhs > R(infinity))
      {
         minside = SOPLEX_MIN(minside, abslhs);
         maxside = SOPLEX_MAX(maxside, abslhs);
      }

      if(absrhs < R(infinity))
      {
         minside = SOPLEX_MIN(minside, absrhs);
         maxside = SOPLEX_MAX(maxside, absrhs);
      }
   }

   boundrange = maxbound - minbound;
   siderange = maxside - minside;
   objrange = maxobj - minobj;
}